

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkBddToMuxes(Abc_Ntk_t *pNtk,int fGlobal,int Limit)

{
  int iVar1;
  Abc_Ntk_t *pNtkNew;
  int Limit_local;
  int fGlobal_local;
  Abc_Ntk_t *pNtk_local;
  
  pNtk_local = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  if (fGlobal == 0) {
    Abc_NtkBddToMuxesPerform(pNtk,pNtk_local);
    Abc_NtkFinalize(pNtk,pNtk_local);
  }
  else {
    iVar1 = Abc_NtkBddToMuxesPerformGlo(pNtk,pNtk_local,Limit);
    if (iVar1 == 0) {
      Abc_NtkDelete(pNtk_local);
      return (Abc_Ntk_t *)0x0;
    }
  }
  iVar1 = Abc_NtkCheck(pNtk_local);
  if (iVar1 == 0) {
    printf("Abc_NtkBddToMuxes: The network check has failed.\n");
    Abc_NtkDelete(pNtk_local);
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  return pNtk_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkBddToMuxes( Abc_Ntk_t * pNtk, int fGlobal, int Limit )
{
    Abc_Ntk_t * pNtkNew;
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    if ( fGlobal ) 
    {
        if ( !Abc_NtkBddToMuxesPerformGlo( pNtk, pNtkNew, Limit ) )
        {
            Abc_NtkDelete( pNtkNew );
            return NULL;
        }
    }
    else
    {
        Abc_NtkBddToMuxesPerform( pNtk, pNtkNew );
        Abc_NtkFinalize( pNtk, pNtkNew );
    }
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkBddToMuxes: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}